

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.hpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::
DelId<ot::commissioner::persistent_storage::Domain,ot::commissioner::persistent_storage::DomainId>
          (PersistentStorageJson *this,RegistrarId *aId,string *aArrName)

{
  json *this_00;
  Status SVar1;
  reference pvVar2;
  reference this_01;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  itEnd;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_110;
  iterator local_f0;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_d0;
  iterator local_b0;
  iterator local_90;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_70;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_50;
  
  this_00 = &this->mCache;
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_00,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin(&local_90,pvVar2);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_00,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end(&local_b0,pvVar2);
  local_110.m_object = local_90.m_object;
  local_110.m_it.object_iterator._M_node = local_90.m_it.object_iterator._M_node;
  local_110.m_it.array_iterator._M_current = local_90.m_it.array_iterator._M_current;
  local_110.m_it.primitive_iterator.m_it = local_90.m_it.primitive_iterator.m_it;
  local_50.m_object = local_b0.m_object;
  local_50.m_it.object_iterator._M_node = local_b0.m_it.object_iterator._M_node;
  local_50.m_it.array_iterator._M_current = local_b0.m_it.array_iterator._M_current;
  local_50.m_it.primitive_iterator.m_it = local_b0.m_it.primitive_iterator.m_it;
  std::
  __remove_if<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,__gnu_cxx::__ops::_Iter_pred<ot::commissioner::persistent_storage::PersistentStorageJson::DelId<ot::commissioner::persistent_storage::Domain,ot::commissioner::persistent_storage::DomainId>(ot::commissioner::persistent_storage::DomainId_const&,std::__cxx11::string)::_lambda(ot::commissioner::persistent_storage::Domain_const&)_1_>>
            (&local_70,&local_110,&local_50,
             (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_ps_persistent_storage_json_hpp:253:37)>
              )aId);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_00,aArrName);
  local_d0.m_object = local_70.m_object;
  local_d0.m_it.object_iterator._M_node = local_70.m_it.object_iterator._M_node;
  local_d0.m_it.array_iterator._M_current = local_70.m_it.array_iterator._M_current;
  local_d0.m_it.primitive_iterator.m_it = local_70.m_it.primitive_iterator.m_it;
  this_01 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator[](this_00,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end(&local_f0,this_01);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_0>
            (&local_110,pvVar2,&local_d0,&local_f0);
  SVar1 = CacheToFile(this);
  return SVar1;
}

Assistant:

Status DelId(I const &aId, std::string aArrName)
    {
        auto itEnd = std::remove_if(std::begin(mCache[aArrName]), std::end(mCache[aArrName]),
                                    [&aId](const V &el) { return el.mId.mId == aId.mId; });
        mCache[aArrName].erase(itEnd, std::end(mCache[aArrName]));

        return CacheToFile();
    }